

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool Items_SingleStringGetter(void *data,int idx,char **out_text)

{
  size_t sVar1;
  undefined8 *in_RDX;
  int in_ESI;
  char *in_RDI;
  char *p;
  int items_count;
  char *items_separated_by_zeros;
  char *local_38;
  int local_2c;
  bool local_1;
  
  local_38 = in_RDI;
  for (local_2c = 0; (*local_38 != '\0' && (in_ESI != local_2c)); local_2c = local_2c + 1) {
    sVar1 = strlen(local_38);
    local_38 = local_38 + sVar1 + 1;
  }
  if (*local_38 == '\0') {
    local_1 = false;
  }
  else {
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = local_38;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool Items_SingleStringGetter(void* data, int idx, const char** out_text)
{
    // FIXME-OPT: we could pre-compute the indices to fasten this. But only 1 active combo means the waste is limited.
    const char* items_separated_by_zeros = (const char*)data;
    int items_count = 0;
    const char* p = items_separated_by_zeros;
    while (*p)
    {
        if (idx == items_count)
            break;
        p += strlen(p) + 1;
        items_count++;
    }
    if (!*p)
        return false;
    if (out_text)
        *out_text = p;
    return true;
}